

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O2

void uv__platform_invalidate_fd(uv_loop_t *loop,int fd)

{
  uv__io_t **ppuVar1;
  int *piVar2;
  uv__io_t *puVar3;
  bool bVar4;
  uv__epoll_event dummy;
  
  ppuVar1 = loop->watchers;
  if (ppuVar1 != (uv__io_t **)0x0) {
    if (ppuVar1[loop->nwatchers] != (uv__io_t *)0x0) {
      puVar3 = ppuVar1[loop->nwatchers + 1];
      piVar2 = (int *)((long)&ppuVar1[loop->nwatchers]->cb + 4);
      while (bVar4 = puVar3 != (uv__io_t *)0x0, puVar3 = (uv__io_t *)&puVar3[-1].field_0x37, bVar4)
      {
        if (*piVar2 == fd) {
          piVar2[0] = -1;
          piVar2[1] = -1;
        }
        piVar2 = piVar2 + 3;
      }
    }
    if (-1 < loop->backend_fd) {
      dummy.data._4_4_ = 0;
      dummy._0_8_ = 0;
      uv__epoll_ctl(loop->backend_fd,2,fd,&dummy);
    }
    return;
  }
  __assert_fail("loop->watchers != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/linux-core.c"
                ,0x8e,"void uv__platform_invalidate_fd(uv_loop_t *, int)");
}

Assistant:

void uv__platform_invalidate_fd(uv_loop_t* loop, int fd) {
  struct uv__epoll_event* events;
  struct uv__epoll_event dummy;
  uintptr_t i;
  uintptr_t nfds;

  assert(loop->watchers != NULL);

  events = (struct uv__epoll_event*) loop->watchers[loop->nwatchers];
  nfds = (uintptr_t) loop->watchers[loop->nwatchers + 1];
  if (events != NULL)
    /* Invalidate events with same file descriptor */
    for (i = 0; i < nfds; i++)
      if ((int) events[i].data == fd)
        events[i].data = -1;

  /* Remove the file descriptor from the epoll.
   * This avoids a problem where the same file description remains open
   * in another process, causing repeated junk epoll events.
   *
   * We pass in a dummy epoll_event, to work around a bug in old kernels.
   */
  if (loop->backend_fd >= 0) {
    /* Work around a bug in kernels 3.10 to 3.19 where passing a struct that
     * has the EPOLLWAKEUP flag set generates spurious audit syslog warnings.
     */
    memset(&dummy, 0, sizeof(dummy));
    uv__epoll_ctl(loop->backend_fd, UV__EPOLL_CTL_DEL, fd, &dummy);
  }
}